

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

bool __thiscall ON_CheckSum::CheckFile(ON_CheckSum *this,FILE *fp,bool bSkipTimeCheck)

{
  bool bVar1;
  size_t sVar2;
  int local_45c;
  ulong uStack_458;
  int i;
  size_t sz;
  size_t maxsize;
  size_t sz0;
  ON__UINT32 crc;
  int count;
  uchar buffer [1024];
  time_t filetime;
  size_t filesize;
  FILE *pFStack_20;
  bool bSkipTimeCheck_local;
  FILE *fp_local;
  ON_CheckSum *this_local;
  
  if (fp == (FILE *)0x0) {
    return false;
  }
  filetime = 0;
  buffer[0x3f8] = '\0';
  buffer[0x3f9] = '\0';
  buffer[0x3fa] = '\0';
  buffer[0x3fb] = '\0';
  buffer[0x3fc] = '\0';
  buffer[0x3fd] = '\0';
  buffer[0x3fe] = '\0';
  buffer[0x3ff] = '\0';
  filesize._7_1_ = bSkipTimeCheck;
  pFStack_20 = (FILE *)fp;
  fp_local = (FILE *)this;
  bVar1 = ON::GetFileStats(fp,(size_t *)&filetime,(time_t *)0x0,(time_t *)(buffer + 0x3f8));
  if (bVar1) {
    if (this->m_size != filetime) {
      return false;
    }
    if (((filesize._7_1_ & 1) == 0) && (this->m_time != buffer._1016_8_)) {
      return false;
    }
  }
  sz0._4_4_ = 0x400;
  sz0._0_4_ = 0;
  maxsize = 0;
  sz = 0x40000;
  uStack_458 = 0;
  local_45c = 0;
  while( true ) {
    if (6 < local_45c) {
      while (sz0._4_4_ == 0x400) {
        sVar2 = fread(&crc,1,0x400,pFStack_20);
        sz0._4_4_ = (int)sVar2;
        if (0 < sz0._4_4_) {
          uStack_458 = (long)sz0._4_4_ + uStack_458;
          sz0._0_4_ = ON_CRC32((ON__UINT32)sz0,(long)sz0._4_4_,&crc);
        }
      }
      if (this->m_crc[7] == (ON__UINT32)sz0) {
        if (uStack_458 == this->m_size) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
      return this_local._7_1_;
    }
    maxsize = sz + maxsize;
    while (sz0._4_4_ == 0x400 && uStack_458 < maxsize) {
      sVar2 = fread(&crc,1,0x400,pFStack_20);
      sz0._4_4_ = (int)sVar2;
      if (0 < sz0._4_4_) {
        uStack_458 = (long)sz0._4_4_ + uStack_458;
        sz0._0_4_ = ON_CRC32((ON__UINT32)sz0,(long)sz0._4_4_,&crc);
      }
    }
    sz = sz << 1;
    if (this->m_crc[local_45c] != (ON__UINT32)sz0) break;
    local_45c = local_45c + 1;
  }
  return false;
}

Assistant:

bool ON_CheckSum::CheckFile( 
  FILE* fp,
  bool bSkipTimeCheck
  ) const
{
  if ( !fp )
    return false;

  size_t filesize=0;
  time_t filetime=0;
  if ( ON::GetFileStats( fp, &filesize, nullptr, &filetime ) )
  {
    if ( m_size != filesize )
    {
      return false;
    }

    if ( !bSkipTimeCheck && m_time != filetime)
    {
      return false;
    }
  }

  unsigned char buffer[1024];
  int count=1024;
  ON__UINT32 crc = 0;
  size_t sz0 = 0, maxsize = 0x40000;
  size_t sz = 0;

  for( int i = 0; i < 7; i++ )
  {
    sz0 += maxsize;
    while(1024 == count && sz < sz0)
    {
      count = (int)fread( buffer, 1, 1024, fp ); // the (int) is for 64 bit size_t conversion
      if ( count > 0 )
      {
        sz += count;
        crc = ON_CRC32( crc, count, buffer );
      }
    }
    maxsize *= 2;
    if ( m_crc[i] != crc )
      return false;
  }

  while(1024 == count)
  {
    count = (int)fread( buffer, 1, 1024, fp ); // the (int) is for 64 bit size_t conversion
    if ( count > 0 )
    {
      sz += count;
      crc = ON_CRC32( crc, count, buffer );
    }
  }
  if (m_crc[7] != crc)
    return false;

  if ( sz != m_size )
    return false;

  return true;
}